

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet
          (TessellationShaderInvarianceRule7Test *this,float *base_triangle_data,float *vertex_data,
          uint vertex_data_n_vertices)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  if (vertex_data_n_vertices < 3) {
    return false;
  }
  bVar1 = TessellationShaderUtils::isTriangleDefined(vertex_data,base_triangle_data);
  bVar3 = true;
  if (!bVar1) {
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      if (uVar2 == (ulong)vertex_data_n_vertices / 3) break;
      bVar1 = TessellationShaderUtils::isTriangleDefined
                        (vertex_data + (uint)((int)uVar2 * 9),base_triangle_data);
    } while (!bVar1);
    bVar3 = uVar2 < (ulong)vertex_data_n_vertices / 3;
  }
  return bVar3;
}

Assistant:

bool TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet(const float* base_triangle_data,
																			 const float* vertex_data,
																			 unsigned int vertex_data_n_vertices)
{
	bool result = false;

	for (unsigned int n_triangle = 0; n_triangle < vertex_data_n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* current_triangle_data = vertex_data +
											 n_triangle * 3 * /* vertices per triangle */
												 3;			  /* components */

		if (TessellationShaderUtils::isTriangleDefined(current_triangle_data, base_triangle_data))
		{
			result = true;

			break;
		}
	} /* for (all vertices) */

	return result;
}